

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall ParserTest_temp_parser_Test::TestBody(ParserTest_temp_parser_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Uninitialized<void_*,_true> _Var2;
  char cVar3;
  pointer *__ptr;
  TrueWithString gtest_msg;
  TrueWithString gtest_msg_1;
  parser_registration<test_parser> test_tmp_registration;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d8 [64];
  long *local_198 [2];
  long local_188 [3];
  parser_registration<test_parser> local_170;
  string local_168;
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  undefined1 local_108 [96];
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_a8;
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_68;
  
  paVar1 = &local_1f8.field_2;
  local_1f8.field_2._8_8_ = 0;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_allocated_capacity = 0;
  local_1f8._M_dataplus._M_p = (pointer)paVar1;
  cVar3 = testing::internal::AlwaysTrue();
  if (cVar3 != '\0') {
    jessilib::object::object((object *)local_1d8,(uchar *)"test_data");
    local_198[0] = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"test_tmp","");
    jessilib::serialize_object((object *)local_108,(string *)local_1d8);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if (local_198[0] != local_188) {
      operator_delete(local_198[0],local_188[0] + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                         *)local_1d8);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_1f8,0,local_1f8._M_string_length,
             "Expected: serialize_object(u8\"test_data\", \"test_tmp\") throws an exception of type format_not_available.\n  Actual: it throws nothing."
             ,0x84);
  testing::Message::Message((Message *)local_1d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_198,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parser.cpp"
             ,0x93,local_1f8._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_198,(Message *)local_1d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_198);
  if ((void *)local_1d8._0_8_ != (void *)0x0) {
    (**(code **)(*(long *)local_1d8._0_8_ + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  _Var2._M_storage = local_1d8 + 0x10;
  local_1d8._24_8_ = 0;
  local_1d8._8_8_ = 0;
  local_1d8._16_8_ = 0;
  local_1d8._0_8_ = _Var2._M_storage;
  cVar3 = testing::internal::AlwaysTrue();
  if (cVar3 != '\0') {
    local_1f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"test_tmp","");
    jessilib::deserialize_object(&local_68,9,"test_data",&local_1f8);
    std::__detail::__variant::
    _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
    ::~_Variant_storage(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,0,
             local_1d8._8_8_,
             "Expected: deserialize_object(u8\"test_data\"sv, \"test_tmp\") throws an exception of type format_not_available.\n  Actual: it throws nothing."
             ,0x88);
  testing::Message::Message((Message *)&local_1f8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_198,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parser.cpp"
             ,0x94,(char *)local_1d8._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_198,(Message *)&local_1f8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_1f8._M_dataplus._M_p + 8))();
  }
  if ((void *)local_1d8._0_8_ != _Var2._M_storage) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"test_tmp","");
  jessilib::parser_registration<test_parser>::parser_registration(&local_170,&local_168,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  local_1f8.field_2._8_8_ = 0;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_allocated_capacity = 0;
  local_1f8._M_dataplus._M_p = (pointer)paVar1;
  cVar3 = testing::internal::AlwaysTrue();
  if (cVar3 != '\0') {
    jessilib::object::object((object *)local_1d8,(uchar *)"test_data");
    local_198[0] = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"test_tmp","");
    jessilib::serialize_object((object *)local_128,(string *)local_1d8);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    if (local_198[0] != local_188) {
      operator_delete(local_198[0],local_188[0] + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                         *)local_1d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  local_1d8._24_8_ = 0;
  local_1d8._8_8_ = 0;
  local_1d8._16_8_ = 0;
  local_1d8._0_8_ = _Var2._M_storage;
  cVar3 = testing::internal::AlwaysTrue();
  if (cVar3 != '\0') {
    local_1f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"test_tmp","");
    jessilib::deserialize_object(&local_a8,9,"test_data",&local_1f8);
    std::__detail::__variant::
    _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
    ::~_Variant_storage(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((void *)local_1d8._0_8_ != _Var2._M_storage) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  jessilib::parser_registration<test_parser>::~parser_registration(&local_170);
  local_1f8.field_2._8_8_ = 0;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_allocated_capacity = 0;
  local_1f8._M_dataplus._M_p = (pointer)paVar1;
  cVar3 = testing::internal::AlwaysTrue();
  if (cVar3 != '\0') {
    jessilib::object::object((object *)local_1d8,(uchar *)"test_data");
    local_198[0] = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"test_tmp","");
    jessilib::serialize_object((object *)local_148,(string *)local_1d8);
    if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
    }
    if (local_198[0] != local_188) {
      operator_delete(local_198[0],local_188[0] + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                         *)local_1d8);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_1f8,0,local_1f8._M_string_length,
             "Expected: serialize_object(u8\"test_data\", \"test_tmp\") throws an exception of type format_not_available.\n  Actual: it throws nothing."
             ,0x84);
  testing::Message::Message((Message *)local_1d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_198,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parser.cpp"
             ,0x9c,local_1f8._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_198,(Message *)local_1d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_198);
  if ((void *)local_1d8._0_8_ != (void *)0x0) {
    (**(code **)(*(long *)local_1d8._0_8_ + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  local_1d8._24_8_ = 0;
  local_1d8._8_8_ = 0;
  local_1d8._16_8_ = 0;
  local_1d8._0_8_ = _Var2._M_storage;
  cVar3 = testing::internal::AlwaysTrue();
  if (cVar3 != '\0') {
    local_1f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"test_tmp","");
    jessilib::deserialize_object(local_108 + 0x20,9,"test_data",&local_1f8);
    std::__detail::__variant::
    _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                         *)(local_108 + 0x20));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,0,
             local_1d8._8_8_,
             "Expected: deserialize_object(u8\"test_data\"sv, \"test_tmp\") throws an exception of type format_not_available.\n  Actual: it throws nothing."
             ,0x88);
  testing::Message::Message((Message *)&local_1f8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_198,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parser.cpp"
             ,0x9d,(char *)local_1d8._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_198,(Message *)&local_1f8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_1f8._M_dataplus._M_p + 8))();
  }
  if ((void *)local_1d8._0_8_ != _Var2._M_storage) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  return;
}

Assistant:

TEST_F(ParserTest, temp_parser) {
	EXPECT_THROW(serialize_object(u8"test_data", "test_tmp"), format_not_available);
	EXPECT_THROW(deserialize_object(u8"test_data"sv, "test_tmp"), format_not_available);

	{
		parser_registration<test_parser> test_tmp_registration{ "test_tmp" };
		EXPECT_NO_THROW(serialize_object(u8"test_data", "test_tmp"));
		EXPECT_NO_THROW(deserialize_object(u8"test_data"sv, "test_tmp"));
	}

	EXPECT_THROW(serialize_object(u8"test_data", "test_tmp"), format_not_available);
	EXPECT_THROW(deserialize_object(u8"test_data"sv, "test_tmp"), format_not_available);
}